

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

ON_HistoryRecord * __thiscall
ON_HistoryRecord::operator=(ON_HistoryRecord *this,ON_HistoryRecord *src)

{
  bool bVar1;
  
  if (this != src) {
    bVar1 = ON_ModelComponent::IsSystemComponent(&this->super_ON_ModelComponent);
    if (!bVar1) {
      ON_ModelComponent::operator=(&this->super_ON_ModelComponent,&this->super_ON_ModelComponent);
      Internal_Destroy(this);
      ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
      Internal_Copy(this,src);
    }
  }
  return this;
}

Assistant:

ON_HistoryRecord& ON_HistoryRecord::operator=(const ON_HistoryRecord& src)
{
  if ( this != &src && false == this->IsSystemComponent() )
  {
    ON_ModelComponent::operator=(*this);
    Internal_Destroy();
    ON_Object::operator=(src);
    Internal_Copy(src);
  }
  return *this;
}